

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module_group.hpp
# Opt level: O0

SerialProcessor<double,_boost::hana::tuple<chains::ProcessorHost<chains::delay::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>,_chains::Parameter<chains::delay::Length>_>_>_>
* __thiscall
chains::
ModuleGroup<chains::SerialProcessor,_chains::ModuleHost<chains::delay::Module,_std::tuple<chains::Parameter<chains::delay::Length>_>,_chains::Expose<chains::delay::Length>_>_>
::makeProcessor<double>
          (SerialProcessor<double,_boost::hana::tuple<chains::ProcessorHost<chains::delay::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>,_chains::Parameter<chains::delay::Length>_>_>_>
           *__return_storage_ptr__,
          ModuleGroup<chains::SerialProcessor,_chains::ModuleHost<chains::delay::Module,_std::tuple<chains::Parameter<chains::delay::Length>_>,_chains::Expose<chains::delay::Length>_>_>
          *this,double sampleRate)

{
  tuple<chains::ProcessorHost<chains::delay::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>,_chains::Parameter<chains::delay::Length>_>_>
  local_80;
  undefined1 local_50 [8];
  tuple<chains::ProcessorHost<chains::delay::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>,_chains::Parameter<chains::delay::Length>_>_>
  moduleProcessors;
  double sampleRate_local;
  ModuleGroup<chains::SerialProcessor,_chains::ModuleHost<chains::delay::Module,_std::tuple<chains::Parameter<chains::delay::Length>_>,_chains::Expose<chains::delay::Length>_>_>
  *this_local;
  
  moduleProcessors.storage_.
  super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL>,_chains::ProcessorHost<chains::delay::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>,_chains::Parameter<chains::delay::Length>_>_>
  .
  super_ebo<boost::hana::detail::bti<0UL>,_chains::ProcessorHost<chains::delay::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>,_chains::Parameter<chains::delay::Length>_>,_false>
  .data_.processor_.buffer_.m_size = (size_type)sampleRate;
  makeProcessors<double>
            ((tuple<chains::ProcessorHost<chains::delay::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>,_chains::Parameter<chains::delay::Length>_>_>
              *)local_50,this,sampleRate);
  boost::hana::
  tuple<chains::ProcessorHost<chains::delay::Module::Processor<double,boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,0ul>>,boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,chains::Input>>>>,boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,0ul>>,boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,chains::Input>>>,chains::Parameter<chains::delay::Length>>>
  ::tuple<,void>((tuple<chains::ProcessorHost<chains::delay::Module::Processor<double,boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,0ul>>,boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,chains::Input>>>>,boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,0ul>>,boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,chains::Input>>>,chains::Parameter<chains::delay::Length>>>
                  *)&local_80,
                 (tuple<chains::ProcessorHost<chains::delay::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>,_chains::Parameter<chains::delay::Length>_>_>
                  *)local_50);
  SerialProcessor<double,_boost::hana::tuple<chains::ProcessorHost<chains::delay::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>,_chains::Parameter<chains::delay::Length>_>_>_>
  ::ProcessorGroup(__return_storage_ptr__,&local_80);
  boost::hana::
  tuple<chains::ProcessorHost<chains::delay::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>,_chains::Parameter<chains::delay::Length>_>_>
  ::~tuple(&local_80);
  boost::hana::
  tuple<chains::ProcessorHost<chains::delay::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>,_chains::Parameter<chains::delay::Length>_>_>
  ::~tuple((tuple<chains::ProcessorHost<chains::delay::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>,_chains::Parameter<chains::delay::Length>_>_>
            *)local_50);
  return __return_storage_ptr__;
}

Assistant:

auto makeProcessor(const double sampleRate) const
  {
    auto moduleProcessors = makeProcessors<T>(sampleRate);
    return ProcessorGroup<T, decltype(moduleProcessors)>{moduleProcessors};
  }